

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::UploadUsingCopyNamedBufferSubData
          (DataTest *this,GLuint id,GLenum parameter)

{
  uint in_EAX;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLuint auxiliary_buffer;
  undefined8 uStack_28;
  long lVar3;
  
  uStack_28._0_4_ = in_EAX;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (*this->m_pNamedBufferData)(id,0x34,(GLvoid *)0x0,parameter);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glNamedBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1cb);
  uStack_28 = (ulong)(uint)uStack_28;
  (**(code **)(lVar3 + 0x6c8))(1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1d3);
  (**(code **)(lVar3 + 0x40))(0x8892,uStack_28._4_4_);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1d6);
  (**(code **)(lVar3 + 0x150))(0x8892,0x34,s_reference,parameter);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1d9);
  (*this->m_pCopyNamedBufferSubData)(uStack_28._4_4_,id,0,0,0x34);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glCopyNamedBufferSubData failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1dc);
  if (uStack_28._4_4_ != 0) {
    (**(code **)(lVar3 + 0x438))(1,(long)&uStack_28 + 4);
  }
  return;
}

Assistant:

void DataTest::UploadUsingCopyNamedBufferSubData(glw::GLuint id, glw::GLenum parameter)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_pNamedBufferData(id, s_reference_size, DE_NULL, parameter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

	glw::GLuint auxiliary_buffer	   = 0;
	bool		auxiliary_buffer_is_ok = true;

	try
	{
		gl.genBuffers(1, &auxiliary_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, auxiliary_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer failed.");

		gl.bufferData(GL_ARRAY_BUFFER, s_reference_size, s_reference, parameter);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData failed.");

		m_pCopyNamedBufferSubData(auxiliary_buffer, id, 0, 0, s_reference_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyNamedBufferSubData failed.");
	}
	catch (...)
	{
		auxiliary_buffer_is_ok = false;
	}

	if (auxiliary_buffer)
	{
		gl.deleteBuffers(1, &auxiliary_buffer);
	}

	if (!auxiliary_buffer_is_ok)
	{
		throw 0;
	}
}